

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcdgen.h
# Opt level: O0

void __thiscall
VcdGen::Signal::value_at
          (Signal *this,
          vector<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
          *tick_data)

{
  TickData *this_00;
  vector<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
  local_38;
  TickData *local_20;
  TickData *data;
  vector<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
  *tick_data_local;
  Signal *this_local;
  
  data = (TickData *)tick_data;
  tick_data_local =
       (vector<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
        *)this;
  this_00 = get_tick_data();
  local_20 = this_00;
  std::
  vector<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
  ::vector(&local_38,tick_data);
  TickData::append(this_00,&local_38,this);
  std::
  vector<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
  ::~vector(&local_38);
  return;
}

Assistant:

void value_at( vector<tuple<uint64_t, uint32_t>> tick_data ){
        TickData& data = get_tick_data();
        data.append(tick_data, this);
    }